

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
FMultiBlockLinesIterator::startIteratorForGroup(FMultiBlockLinesIterator *this,int group)

{
  double dVar1;
  sector_t_conflict *psVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  dVar4 = 0.0;
  if (this->basegroup != group) {
    dVar3 = Displacements.data.Array[Displacements.size * group + (int)this->basegroup].pos.X;
    dVar4 = Displacements.data.Array[Displacements.size * group + (int)this->basegroup].pos.Y;
  }
  dVar3 = (this->checkpoint).X + dVar3;
  dVar4 = (this->checkpoint).Y + dVar4;
  (this->offset).X = dVar3;
  (this->offset).Y = dVar4;
  psVar2 = (sector_t_conflict *)this->startsector;
  if (psVar2->PortalGroup != group) {
    psVar2 = P_PointInSector(&this->offset);
    dVar3 = (this->offset).X;
    dVar4 = (this->offset).Y;
  }
  this->cursector = (sector_t *)psVar2;
  dVar1 = (this->checkpoint).Z;
  (this->bbox).m_Box[0] = dVar4 + dVar1;
  (this->bbox).m_Box[3] = dVar3 + dVar1;
  (this->bbox).m_Box[1] = dVar4 - dVar1;
  (this->bbox).m_Box[2] = dVar3 - dVar1;
  FBlockLinesIterator::init(&this->blockIterator,(EVP_PKEY_CTX *)&this->bbox);
  return;
}

Assistant:

void FMultiBlockLinesIterator::startIteratorForGroup(int group)
{
	offset = Displacements.getOffset(basegroup, group);
	offset.X += checkpoint.X;
	offset.Y += checkpoint.Y;
	cursector = group == startsector->PortalGroup ? startsector : P_PointInSector(offset);
	bbox.setBox(offset.X, offset.Y, checkpoint.Z);
	blockIterator.init(bbox);
}